

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignExtLowering.cpp
# Opt level: O1

void __thiscall wasm::SignExtLowering::visitUnary(SignExtLowering *this,Unary *curr)

{
  Expression *pEVar1;
  int originalBits;
  long originalBits_00;
  
  switch(curr->op) {
  case ExtendS8Int32:
    pEVar1 = curr->value;
    originalBits = 8;
    goto LAB_00a5bccd;
  case ExtendS16Int32:
    pEVar1 = curr->value;
    originalBits = 0x10;
LAB_00a5bccd:
    lowerToShifts<int>(this,pEVar1,ShlInt32,ShrSInt32,originalBits);
    return;
  case ExtendS8Int64:
    pEVar1 = curr->value;
    originalBits_00 = 8;
    break;
  case ExtendS16Int64:
    pEVar1 = curr->value;
    originalBits_00 = 0x10;
    break;
  case ExtendS32Int64:
    pEVar1 = curr->value;
    originalBits_00 = 0x20;
    break;
  default:
    return;
  }
  lowerToShifts<long>(this,pEVar1,ShlInt64,ShrSInt64,originalBits_00);
  return;
}

Assistant:

void visitUnary(Unary* curr) {
    switch (curr->op) {
      case ExtendS8Int32:
        lowerToShifts(curr->value, ShlInt32, ShrSInt32, int32_t(8));
        break;
      case ExtendS16Int32:
        lowerToShifts(curr->value, ShlInt32, ShrSInt32, int32_t(16));
        break;
      case ExtendS8Int64:
        lowerToShifts(curr->value, ShlInt64, ShrSInt64, int64_t(8));
        break;
      case ExtendS16Int64:
        lowerToShifts(curr->value, ShlInt64, ShrSInt64, int64_t(16));
        break;
      case ExtendS32Int64:
        lowerToShifts(curr->value, ShlInt64, ShrSInt64, int64_t(32));
        break;
      default: {
      }
    }
  }